

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

Builder * __thiscall
capnp::anon_unknown_0::MembraneCapTableBuilder::imbue
          (Builder *__return_storage_ptr__,MembraneCapTableBuilder *this,Builder builder)

{
  PointerBuilder builder_00;
  Builder *builder_01;
  CapTableBuilder *pCVar1;
  PointerBuilder local_58;
  undefined1 local_40 [8];
  PointerBuilder pointerBuilder;
  Fault local_18;
  Fault f;
  MembraneCapTableBuilder *this_local;
  
  f.exception = (Exception *)this;
  if (this->inner == (CapTableBuilder *)0x0) {
    builder_01 = kj::mv<capnp::AnyPointer::Builder>(&builder);
    capnp::_::PointerHelpers<capnp::AnyPointer,_(capnp::Kind)7>::getInternalBuilder
              ((PointerBuilder *)local_40,builder_01);
    pCVar1 = capnp::_::PointerBuilder::getCapTable((PointerBuilder *)local_40);
    this->inner = pCVar1;
    capnp::_::PointerBuilder::imbue
              (&local_58,(PointerBuilder *)local_40,&this->super_CapTableBuilder);
    builder_00.capTable = local_58.capTable;
    builder_00.segment = local_58.segment;
    builder_00.pointer = local_58.pointer;
    AnyPointer::Builder::Builder(__return_storage_ptr__,builder_00);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane.c++"
             ,0x52,FAILED,"inner == nullptr","\"can only call this once\"",
             (char (*) [24])"can only call this once");
  kj::_::Debug::Fault::fatal(&local_18);
}

Assistant:

AnyPointer::Builder imbue(AnyPointer::Builder builder) {
    KJ_REQUIRE(inner == nullptr, "can only call this once");
    auto pointerBuilder = _::PointerHelpers<AnyPointer>::getInternalBuilder(kj::mv(builder));
    inner = pointerBuilder.getCapTable();
    return AnyPointer::Builder(pointerBuilder.imbue(this));
  }